

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_5f39::extractDataPart
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *bstring)

{
  value_type vVar1;
  long lVar2;
  ulong uVar3;
  value_type *pvVar4;
  reference pvVar5;
  ulong local_60;
  size_type i;
  allocator<unsigned_char> local_42;
  undefined1 local_41;
  string local_40 [8];
  string dpstr;
  uint64_t pos;
  string *bstring_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dp;
  
  dpstr.field_2._8_8_ = findSeparatorPosition(bstring);
  std::__cxx11::string::substr((ulong)local_40,(ulong)bstring);
  local_41 = 0;
  lVar2 = std::__cxx11::string::size();
  uVar3 = ~dpstr.field_2._8_8_;
  std::allocator<unsigned_char>::allocator(&local_42);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,uVar3 + lVar2,&local_42);
  std::allocator<unsigned_char>::~allocator(&local_42);
  for (local_60 = 0; uVar3 = std::__cxx11::string::size(), local_60 < uVar3; local_60 = local_60 + 1
      ) {
    pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)local_40);
    vVar1 = *pvVar4;
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,local_60);
    *pvVar5 = vVar1;
  }
  local_41 = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> extractDataPart(const std::string & bstring) {
        auto pos = findSeparatorPosition(bstring);
        std::string dpstr = bstring.substr(pos+1);
        // convert dpstr to dp vector
        std::vector<unsigned char> dp(bstring.size() - (pos + 1));
        for(std::string::size_type i = 0; i < dpstr.size(); ++i) {
            dp[i] = static_cast<unsigned char>(dpstr[i]);
        }
        return dp;
    }